

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void test_then_block(LexState *ls,int *escapelist)

{
  undefined8 fs_00;
  undefined8 l1;
  int iVar1;
  TString *name;
  int local_54;
  int line;
  int jf;
  expdesc v;
  FuncState *fs;
  BlockCnt bl;
  int *escapelist_local;
  LexState *ls_local;
  
  v._16_8_ = ls->fs;
  bl._16_8_ = escapelist;
  luaX_next(ls);
  expr(ls,(expdesc *)&line);
  checknext(ls,0x112);
  if ((ls->t).token == 0x101) {
    iVar1 = ls->linenumber;
    luaK_goiffalse(ls->fs,(expdesc *)&line);
    luaX_next(ls);
    enterblock((FuncState *)v._16_8_,(BlockCnt *)&fs,'\0');
    name = luaS_newlstr(ls->L,"break",5);
    newgotoentry(ls,name,iVar1,v.u.info);
    do {
      iVar1 = testnext(ls,0x3b);
    } while (iVar1 != 0);
    iVar1 = block_follow(ls,0);
    if (iVar1 != 0) {
      leaveblock((FuncState *)v._16_8_);
      return;
    }
    local_54 = luaK_jump((FuncState *)v._16_8_);
  }
  else {
    luaK_goiftrue(ls->fs,(expdesc *)&line);
    enterblock((FuncState *)v._16_8_,(BlockCnt *)&fs,'\0');
    local_54 = v.u.ival._4_4_;
  }
  statlist(ls);
  leaveblock((FuncState *)v._16_8_);
  l1 = bl._16_8_;
  fs_00 = v._16_8_;
  if (((ls->t).token == 0x103) || ((ls->t).token == 0x104)) {
    iVar1 = luaK_jump((FuncState *)v._16_8_);
    luaK_concat((FuncState *)fs_00,(int *)l1,iVar1);
  }
  luaK_patchtohere((FuncState *)v._16_8_,local_54);
  return;
}

Assistant:

static void test_then_block (LexState *ls, int *escapelist) {
  /* test_then_block -> [IF | ELSEIF] cond THEN block */
  BlockCnt bl;
  FuncState *fs = ls->fs;
  expdesc v;
  int jf;  /* instruction to skip 'then' code (if condition is false) */
  luaX_next(ls);  /* skip IF or ELSEIF */
  expr(ls, &v);  /* read condition */
  checknext(ls, TK_THEN);
  if (ls->t.token == TK_BREAK) {  /* 'if x then break' ? */
    int line = ls->linenumber;
    luaK_goiffalse(ls->fs, &v);  /* will jump if condition is true */
    luaX_next(ls);  /* skip 'break' */
    enterblock(fs, &bl, 0);  /* must enter block before 'goto' */
    newgotoentry(ls, luaS_newliteral(ls->L, "break"), line, v.t);
    while (testnext(ls, ';')) {}  /* skip semicolons */
    if (block_follow(ls, 0)) {  /* jump is the entire block? */
      leaveblock(fs);
      return;  /* and that is it */
    }
    else  /* must skip over 'then' part if condition is false */
      jf = luaK_jump(fs);
  }
  else {  /* regular case (not a break) */
    luaK_goiftrue(ls->fs, &v);  /* skip over block if condition is false */
    enterblock(fs, &bl, 0);
    jf = v.f;
  }
  statlist(ls);  /* 'then' part */
  leaveblock(fs);
  if (ls->t.token == TK_ELSE ||
      ls->t.token == TK_ELSEIF)  /* followed by 'else'/'elseif'? */
    luaK_concat(fs, escapelist, luaK_jump(fs));  /* must jump over it */
  luaK_patchtohere(fs, jf);
}